

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

optional<QHttpHeaders::WellKnownHeader> HeaderName::toWellKnownHeader(QByteArrayView name)

{
  bool bVar1;
  ulong uVar2;
  char *in_RSI;
  size_t in_RDI;
  quint8 *pqVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  Char *local_60;
  QByteArrayView local_58;
  QByteArrayView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pqVar3 = "";
  uVar2 = 0xb1;
  while (uVar4 = uVar2, 0 < (long)uVar4) {
    uVar2 = uVar4 >> 1;
    __x = (basic_string_view<char,_std::char_traits<char>_>)
          QOffsetStringArray<std::array<char,_2515UL>,_std::array<unsigned_short,_178UL>_>::viewAt
                    (&headerNames,(ulong)pqVar3[uVar2]);
    __y._M_str = in_RSI;
    __y._M_len = in_RDI;
    bVar1 = std::operator<(__x,__y);
    if (bVar1) {
      pqVar3 = pqVar3 + uVar2 + 1;
      uVar2 = ~uVar2 + uVar4;
    }
  }
  if (pqVar3 != (quint8 *)"\n\n") {
    in_RSI = (char *)(ulong)*pqVar3;
    local_60 = QOffsetStringArray<std::array<char,_2515UL>,_std::array<unsigned_short,_178UL>_>::
               operator[](&headerNames,(uint)*pqVar3);
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_58,&local_60);
    bVar1 = comparesEqual(&local_48,&local_58);
    if (bVar1) {
      uVar2 = 0x100000000;
      goto LAB_001878e3;
    }
  }
  uVar2 = 0;
LAB_001878e3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (optional<QHttpHeaders::WellKnownHeader>)(uVar2 | (ulong)in_RSI & 0xffffffff);
}

Assistant:

static std::optional<QHttpHeaders::WellKnownHeader> toWellKnownHeader(QByteArrayView name) noexcept
    {
        auto indexesBegin = std::cbegin(orderedHeaderNameIndexes);
        auto indexesEnd = std::cend(orderedHeaderNameIndexes);

        auto result = std::lower_bound(indexesBegin, indexesEnd, name, ByIndirectHeaderName{});

        if (result != indexesEnd && name == headerNames[*result])
            return static_cast<QHttpHeaders::WellKnownHeader>(*result);
        return std::nullopt;
    }